

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O0

ErrorCode __thiscall ComponentManager::UnloadLibrary(ComponentManager *this,CID cid)

{
  ModuleInfo *pMVar1;
  bool bVar2;
  ModuleInfo **ppMVar3;
  iterator local_50;
  ModuleInfo *local_48;
  ModuleInfo *info;
  undefined1 local_30 [16];
  iterator i;
  ComponentManager *this_local;
  CID cid_local;
  
  i.mNode = (Node *)this;
  this_local = (ComponentManager *)cid.mId;
  JetHead::list<ComponentManager::ModuleInfo_*>::begin
            ((list<ComponentManager::ModuleInfo_*> *)(local_30 + 8));
  do {
    JetHead::list<ComponentManager::ModuleInfo_*>::end
              ((list<ComponentManager::ModuleInfo_*> *)local_30);
    bVar2 = JetHead::list<ComponentManager::ModuleInfo_*>::iterator::operator!=
                      ((iterator *)(local_30 + 8),(iterator *)local_30);
    JetHead::list<ComponentManager::ModuleInfo_*>::iterator::~iterator((iterator *)local_30);
    if (!bVar2) {
      info._0_4_ = 2;
LAB_001050c7:
      JetHead::list<ComponentManager::ModuleInfo_*>::iterator::~iterator((iterator *)(local_30 + 8))
      ;
      if ((int)info != 1) {
        cid_local.mId._4_4_ = kNoClass;
      }
      return cid_local.mId._4_4_;
    }
    ppMVar3 = JetHead::list<ComponentManager::ModuleInfo_*>::iterator::operator*
                        ((iterator *)(local_30 + 8));
    bVar2 = ModuleInfo::operator==(*ppMVar3,(CID *)&this_local);
    if (bVar2) {
      ppMVar3 = JetHead::list<ComponentManager::ModuleInfo_*>::iterator::operator*
                          ((iterator *)(local_30 + 8));
      local_48 = *ppMVar3;
      dlclose(local_48->mHandle);
      pMVar1 = local_48;
      if (local_48 != (ModuleInfo *)0x0) {
        ModuleInfo::~ModuleInfo(local_48);
        operator_delete(pMVar1,0x30);
      }
      JetHead::list<ComponentManager::ModuleInfo_*>::iterator::erase(&local_50);
      JetHead::list<ComponentManager::ModuleInfo_*>::iterator::~iterator(&local_50);
      cid_local.mId._4_4_ = kNoError;
      info._0_4_ = 1;
      goto LAB_001050c7;
    }
    JetHead::list<ComponentManager::ModuleInfo_*>::iterator::operator++((iterator *)(local_30 + 8));
  } while( true );
}

Assistant:

ErrorCode ComponentManager::UnloadLibrary( CID cid )
{
	for (JetHead::list<ModuleInfo*>::iterator i = mModules.begin(); 
		 i != mModules.end(); ++i)
	{
		if (*(*i) == cid)
		{
			ModuleInfo *info = *i;
			dlclose( info->mHandle );
			delete info;
			i.erase();
			return kNoError;
		}
	}
	
	return kNoClass;	
}